

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_mutex.c
# Opt level: O2

uint s_mutex_cancel_dead_waiting_tasks_(void)

{
  long lVar1;
  s_list_t *psVar2;
  s_list_t *psVar3;
  s_list_t *list;
  uint uVar4;
  s_list_t *list_00;
  long *in_FS_OFFSET;
  
  lVar1 = *in_FS_OFFSET;
  psVar2 = s_list_get_next((s_list_t *)(lVar1 + -0x20));
  uVar4 = 0;
  while (psVar2 != (s_list_t *)(lVar1 + -0x20)) {
    psVar3 = s_list_get_next(psVar2);
    s_list_detach(psVar2);
    list_00 = psVar2 + -1;
    list = s_list_get_next(list_00);
    while (psVar2 = psVar3, list != list_00) {
      psVar2 = s_list_get_next(list);
      s_task_cancel_wait(list);
      uVar4 = uVar4 + 1;
      list = psVar2;
    }
  }
  if (uVar4 != 0) {
    fwrite("error: cancel dead tasks waiting on mutex!\n",0x2b,1,_stderr);
  }
  return uVar4;
}

Assistant:

unsigned int s_mutex_cancel_dead_waiting_tasks_() {
    s_list_t *next_mutex;
    s_list_t *this_mutex;
    unsigned int ret = 0;
    /* Check all mutexs */
    for(this_mutex = s_list_get_next(&g_globals.waiting_mutexes);
        this_mutex != &g_globals.waiting_mutexes;
        this_mutex = next_mutex) {
        s_list_t *next_task;
        s_list_t *this_task;
        s_mutex_t *mutex;
        
        next_mutex = s_list_get_next(this_mutex);
        s_list_detach(this_mutex);
        mutex = GET_PARENT_ADDR(this_mutex, s_mutex_t, self);
        
        /* Check all tasks blocked on this mutex */
        for(this_task = s_list_get_next(&mutex->wait_list);
            this_task != &mutex->wait_list;
            this_task = next_task) {
            next_task = s_list_get_next(this_task);
                    
            s_task_t *task = GET_PARENT_ADDR(this_task, s_task_t, node);
            s_task_cancel_wait(task);
            ++ret;
        }
    }

#ifndef NDEBUG
    if (ret > 0) {
        fprintf(stderr, "error: cancel dead tasks waiting on mutex!\n");
    }
#endif

    return ret;
}